

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hvtool.cpp
# Opt level: O1

uint32_t __thiscall HvFile::allocpath(HvFile *this,HKEY root,uint32_t parent,string *path)

{
  uint uVar1;
  pointer psVar2;
  undefined8 uVar3;
  key *this_00;
  long lVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  shared_ptr<ent::base> local_38;
  
  this_00 = (key *)operator_new(0x80);
  ent::key::key(this_00,(uint32_t)
                        ((ulong)((long)(this->_items).
                                       super__Vector_base<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(this->_items).
                                      super__Vector_base<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start) >> 4),path);
  local_38.super___shared_ptr<ent::base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<ent::key*>
            (&local_38.super___shared_ptr<ent::base,_(__gnu_cxx::_Lock_policy)2>._M_refcount,this_00
            );
  std::vector<std::shared_ptr<ent::base>,std::allocator<std::shared_ptr<ent::base>>>::
  emplace_back<std::shared_ptr<ent::base>>
            ((vector<std::shared_ptr<ent::base>,std::allocator<std::shared_ptr<ent::base>>> *)
             &this->_items,&local_38);
  if (local_38.super___shared_ptr<ent::base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<ent::base,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
    ;
  }
  uVar6 = ((this->_items).
           super__Vector_base<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super___shared_ptr<ent::base,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_id & 0xfffffff;
  if (parent == 0) {
    psVar2 = (this->_items).
             super__Vector_base<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar4 = __dynamic_cast(psVar2[this->_rootid].
                           super___shared_ptr<ent::base,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           &ent::base::typeinfo,&ent::roots::typeinfo,0);
    uVar7 = (ulong)root & 0xff;
    uVar1 = *(uint *)(*(long *)(lVar4 + 0x60) + uVar7 * 4);
    if ((uVar1 & 0xfffffff) == 0) {
      *(uint *)(*(long *)(lVar4 + 0x48) + uVar7 * 4) = uVar6 + 0x20000000;
    }
    else {
      lVar4 = __dynamic_cast(*(undefined8 *)
                              ((long)&(psVar2->
                                      super___shared_ptr<ent::base,_(__gnu_cxx::_Lock_policy)2>).
                                      _M_ptr + (ulong)(uVar1 << 4)),&ent::base::typeinfo,
                             &ent::key::typeinfo,0);
      iVar5 = uVar6 + 0x20000000;
      if (uVar6 == 0) {
        iVar5 = 0;
      }
      *(int *)(lVar4 + 0x48) = iVar5;
    }
    lVar4 = __dynamic_cast(psVar2[this->_rootid].
                           super___shared_ptr<ent::base,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                           &ent::base::typeinfo,&ent::roots::typeinfo,0);
    *(uint *)(*(long *)(lVar4 + 0x60) + uVar7 * 4) = uVar6 + 0x20000000;
  }
  else {
    psVar2 = (this->_items).
             super__Vector_base<std::shared_ptr<ent::base>,_std::allocator<std::shared_ptr<ent::base>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar3 = psVar2[parent].super___shared_ptr<ent::base,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    lVar4 = __dynamic_cast(uVar3,&ent::base::typeinfo,&ent::key::typeinfo,0);
    if ((*(uint *)(lVar4 + 0x58) & 0xfffffff) == 0) {
      iVar5 = uVar6 + 0x20000000;
      if (uVar6 == 0) {
        iVar5 = 0;
      }
      *(int *)(lVar4 + 0x4c) = iVar5;
    }
    else {
      lVar4 = __dynamic_cast(*(undefined8 *)
                              ((long)&(psVar2->
                                      super___shared_ptr<ent::base,_(__gnu_cxx::_Lock_policy)2>).
                                      _M_ptr + (ulong)(*(uint *)(lVar4 + 0x58) << 4)),
                             &ent::base::typeinfo,&ent::key::typeinfo,0);
      iVar5 = uVar6 + 0x20000000;
      if (uVar6 == 0) {
        iVar5 = 0;
      }
      *(int *)(lVar4 + 0x48) = iVar5;
    }
    lVar4 = __dynamic_cast(uVar3,&ent::base::typeinfo,&ent::key::typeinfo,0);
    iVar5 = uVar6 + 0x20000000;
    if (uVar6 == 0) {
      iVar5 = 0;
    }
    *(int *)(lVar4 + 0x58) = iVar5;
  }
  return uVar6;
}

Assistant:

uint32_t allocpath(HKEY root, uint32_t parent, const std::string& path)
    {
        _items.push_back(ent::entry_ptr(new ent::key(_items.size(), path)));
        uint32_t id= _items.back()->id();

        if (parent) {
            uint32_t lkey= _items[parent]->askey()->lastchild();
            if (!lkey)
                _items[parent]->askey()->firstchild(id);
            else
                _items[lkey]->askey()->nextsibling(id);
            _items[parent]->askey()->lastchild(id);
        }
        else {
            uint32_t rkey= _items[_rootid]->asroots()->lasthivekey(root);
            if (!rkey)
                _items[_rootid]->asroots()->hiveid(root, id);
            else 
                _items[rkey]->askey()->nextsibling(id);
            _items[_rootid]->asroots()->lasthivekey(root, id);
        }

        return id;
    }